

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

HighsInt __thiscall
HighsDomain::ConflictSet::resolveDepth
          (ConflictSet *this,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *frontier,HighsInt depthLevel,HighsInt stopSize,HighsInt minResolve,
          bool increaseConflictScore)

{
  double dVar1;
  double dVar2;
  pointer p_Var3;
  HighsDomain *pHVar4;
  pointer piVar5;
  LocalDomChg *pLVar6;
  pointer pHVar7;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var8;
  bool bVar9;
  _Base_ptr p_Var10;
  iterator iVar11;
  long lVar12;
  LocalDomChg *i;
  LocalDomChg *__v;
  int iVar13;
  int iVar14;
  int iVar15;
  vector<double,_std::allocator<double>_> *pvVar16;
  int iVar17;
  HighsInt HVar18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  pair<std::_Rb_tree_iterator<HighsDomain::ConflictSet::LocalDomChg>,_bool> pVar21;
  
  p_Var3 = (this->resolveQueue).
           super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolveQueue).
      super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != p_Var3) {
    (this->resolveQueue).
    super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = p_Var3;
  }
  lVar12 = (long)depthLevel;
  if (depthLevel == 0) {
    iVar13 = 0;
  }
  else {
    iVar13 = (this->localdom->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar12 + -1] + 1;
  }
  pHVar4 = this->localdom;
  piVar5 = (pHVar4->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar14 = (int)((ulong)((long)(pHVar4->branchPos_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >> 2);
  iVar15 = iVar14;
  if (iVar14 < depthLevel) {
    iVar15 = depthLevel;
  }
  iVar17 = 1 - depthLevel;
  do {
    if (iVar15 == lVar12) goto LAB_0029d021;
    dVar1 = (pHVar4->domchgstack_).
            super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
            super__Vector_impl_data._M_start[piVar5[lVar12]].boundval;
    dVar2 = (pHVar4->prevboundval_).
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start[piVar5[lVar12]].first;
    lVar12 = lVar12 + 1;
    iVar17 = iVar17 + -1;
  } while ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2)));
  iVar15 = (-(uint)(dVar1 == dVar2) & 1) - iVar17;
LAB_0029d021:
  if (iVar15 == iVar14) {
    p_Var19 = &(frontier->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    p_Var10 = (frontier->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var19 = &(frontier->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (p_Var10 != (_Base_ptr)0x0) {
      do {
        if (piVar5[iVar15] < (int)p_Var10[1]._M_color) {
          p_Var19 = p_Var10;
        }
        p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color <= piVar5[iVar15]];
      } while (p_Var10 != (_Base_ptr)0x0);
    }
  }
  iVar11._M_node = &(frontier->_M_t)._M_impl.super__Rb_tree_header._M_header;
  for (p_Var10 = (frontier->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 != (_Base_ptr)0x0; p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < iVar13]) {
    if (iVar13 <= (int)p_Var10[1]._M_color) {
      iVar11._M_node = p_Var10;
    }
  }
  if (iVar11._M_node == p_Var19) {
    HVar18 = -1;
  }
  else {
    do {
      if ((uint)(this->localdom->domchgreason_).
                super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)iVar11._M_node[1]._M_color].type <
          0xfffffffe) {
        pushQueue(this,iVar11);
      }
      iVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar11._M_node);
    } while (iVar11._M_node != p_Var19);
    HVar18 = 0;
    while( true ) {
      iVar15 = (int)((ulong)((long)(this->resolveQueue).
                                   super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->resolveQueue).
                                  super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((iVar15 <= stopSize) && (iVar15 < 1 || minResolve <= HVar18)) break;
      iVar11 = popQueue(this);
      bVar9 = explainBoundChange(this,frontier,*(LocalDomChg *)(iVar11._M_node + 1));
      if (bVar9) {
        HVar18 = HVar18 + 1;
        std::
        _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
        ::erase_abi_cxx11_((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                            *)frontier,(const_iterator)iVar11._M_node);
        pLVar6 = (this->resolvedDomainChanges).
                 super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__v = (this->resolvedDomainChanges).
                   super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                   ._M_impl.super__Vector_impl_data._M_start; __v != pLVar6; __v = __v + 1) {
          pVar21 = std::
                   _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                   ::_M_insert_unique<HighsDomain::ConflictSet::LocalDomChg_const&>
                             ((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                               *)frontier,__v);
          iVar11._M_node = (_Base_ptr)pVar21.first._M_node;
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            if ((__v->domchg).boundtype == kLower) {
              p_Var20 = (_Base_ptr)(__v->domchg).boundval;
              if ((double)p_Var20 <= (double)iVar11._M_node[1]._M_parent) {
                p_Var20 = iVar11._M_node[1]._M_parent;
              }
            }
            else {
              p_Var20 = (_Base_ptr)(__v->domchg).boundval;
              if ((double)iVar11._M_node[1]._M_parent <= (double)p_Var20) {
                p_Var20 = iVar11._M_node[1]._M_parent;
              }
            }
            iVar11._M_node[1]._M_parent = p_Var20;
          }
          else {
            if (increaseConflictScore) {
              pHVar7 = (this->localdom->domchgstack_).
                       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              _Var8._M_head_impl =
                   (this->localdom->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              lVar12 = (long)pHVar7[__v->pos].column;
              pvVar16 = (vector<double,_std::allocator<double>_> *)
                        ((long)&(_Var8._M_head_impl)->pseudocost + 0x108);
              if (pHVar7[__v->pos].boundtype == kLower) {
                pvVar16 = (vector<double,_std::allocator<double>_> *)
                          ((long)&(_Var8._M_head_impl)->pseudocost + 0xf0);
              }
              *(double *)
               (*(long *)&pvVar16->super__Vector_base<double,_std::allocator<double>_> + lVar12 * 8)
                   = *(double *)((long)&(_Var8._M_head_impl)->pseudocost + 0x120) +
                     *(double *)
                      (*(long *)&pvVar16->super__Vector_base<double,_std::allocator<double>_> +
                      lVar12 * 8);
              *(double *)((long)&(_Var8._M_head_impl)->pseudocost + 0x128) =
                   *(double *)((long)&(_Var8._M_head_impl)->pseudocost + 0x120) +
                   *(double *)((long)&(_Var8._M_head_impl)->pseudocost + 0x128);
            }
            if ((iVar13 <= __v->pos) &&
               ((uint)(this->localdom->domchgreason_).
                      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>.
                      _M_impl.super__Vector_impl_data._M_start[__v->pos].type < 0xfffffffe)) {
              pushQueue(this,iVar11);
            }
          }
        }
      }
    }
  }
  return HVar18;
}

Assistant:

HighsInt HighsDomain::ConflictSet::resolveDepth(std::set<LocalDomChg>& frontier,
                                                HighsInt depthLevel,
                                                HighsInt stopSize,
                                                HighsInt minResolve,
                                                bool increaseConflictScore) {
  clearQueue();
  LocalDomChg startPos =
      LocalDomChg{depthLevel == 0 ? 0 : localdom.branchPos_[depthLevel - 1] + 1,
                  HighsDomainChange()};
  while (depthLevel < (HighsInt)localdom.branchPos_.size()) {
    HighsInt branchPos = localdom.branchPos_[depthLevel];
    if (localdom.domchgstack_[branchPos].boundval !=
        localdom.prevboundval_[branchPos].first)
      break;
    // printf("skipping redundant depth\n");
    ++depthLevel;
  }

  auto iterEnd =
      depthLevel == (HighsInt)localdom.branchPos_.size()
          ? frontier.end()
          : frontier.upper_bound(LocalDomChg{localdom.branchPos_[depthLevel],
                                             HighsDomainChange()});
  bool empty = true;
  for (auto it = frontier.lower_bound(startPos); it != iterEnd; ++it) {
    assert(it != frontier.end());
    empty = false;
    if (resolvable(it->pos)) pushQueue(it);
  }

  if (empty) return -1;

  HighsInt numResolved = 0;

  while (queueSize() > stopSize ||
         (queueSize() > 0 && numResolved < minResolve)) {
    std::set<LocalDomChg>::iterator pos = popQueue();
    if (!explainBoundChange(frontier, *pos)) continue;

    ++numResolved;
    frontier.erase(pos);
    for (const LocalDomChg& i : resolvedDomainChanges) {
      auto insertResult = frontier.insert(i);
      if (insertResult.second) {
        if (increaseConflictScore) {
          if (localdom.domchgstack_[i.pos].boundtype == HighsBoundType::kLower)
            localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreUp(
                localdom.domchgstack_[i.pos].column);
          else
            localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreDown(
                localdom.domchgstack_[i.pos].column);
        }
        if (i.pos >= startPos.pos && resolvable(i.pos))
          pushQueue(insertResult.first);
      } else {
        if (i.domchg.boundtype == HighsBoundType::kLower) {
          // if (insertResult.first->domchg.boundval != i.domchg.boundval)
          //  printf(
          //      "got different relaxed lower bounds: current=%g, new=%g, "
          //      "stack=%g\n",
          //      insertResult.first->domchg.boundval, i.domchg.boundval,
          //      localdom.domchgstack_[i.pos].boundval);
          //
          insertResult.first->domchg.boundval =
              std::max(insertResult.first->domchg.boundval, i.domchg.boundval);
        } else {
          // if (insertResult.first->domchg.boundval != i.domchg.boundval)
          //   printf(
          //       "got different relaxed upper bounds: current=%g, new=%g, "
          //       "stack=%g\n",
          //       insertResult.first->domchg.boundval, i.domchg.boundval,
          //       localdom.domchgstack_[i.pos].boundval);
          insertResult.first->domchg.boundval =
              std::min(insertResult.first->domchg.boundval, i.domchg.boundval);
        }
      }
    }
  }

  return numResolved;
}